

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  char *pcVar1;
  size_t sVar2;
  size_t *psVar3;
  int iVar4;
  CURLcode CVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  size_t *psVar9;
  size_t sVar10;
  char *__s;
  char *local_90;
  URLGlob *local_88;
  curl_off_t num;
  char **local_78;
  size_t *local_70;
  char numbuf [18];
  dynbuf dyn;
  
  *result = (char *)0x0;
  local_90 = filename;
  local_78 = result;
  curlx_dyn_init(&dyn,0x2800);
  local_70 = &glob[-1].size;
  sVar2 = 1;
  sVar10 = 0;
  pcVar7 = "";
  local_88 = glob;
  do {
    __s = local_90;
    sVar6 = sVar2;
    if (*local_90 == '#') {
      if (9 < (byte)(local_90[1] - 0x30U)) goto LAB_0011d75f;
      pcVar1 = local_90 + 1;
      local_90 = pcVar1;
      iVar4 = Curl_str_number(&local_90,&num,local_88->size);
      if (num != 0 && iVar4 == 0) {
        num = num + -1;
        lVar8 = local_88->size + 1;
        psVar3 = local_70;
        do {
          psVar9 = psVar3;
          lVar8 = lVar8 + -1;
          if (lVar8 == 0) goto LAB_0011d77e;
          psVar3 = psVar9 + 6;
        } while (*(int *)((long)psVar9 + 0x34) != (int)num);
        iVar4 = (int)psVar9[6];
        if (iVar4 == 3) {
          __s = numbuf;
          curl_msnprintf(__s,0x12,"%0*ld",*(int *)(psVar9 + 9),psVar9[10]);
LAB_0011d7c9:
          sVar6 = strlen(__s);
          pcVar1 = local_90;
        }
        else {
          pcVar1 = local_90;
          if (iVar4 == 2) {
            numbuf[0] = *(char *)((long)psVar9 + 0x3a);
            numbuf[1] = '\0';
            __s = numbuf;
          }
          else {
            if (iVar4 != 1) {
              curl_mfprintf(tool_stderr,"internal error: invalid pattern type (%d)\n");
              curlx_dyn_free(&dyn);
              return CURLE_FAILED_INIT;
            }
            sVar6 = sVar10;
            __s = pcVar7;
            if (psVar9[7] != 0) {
              __s = *(char **)(psVar9[7] + (long)*(int *)(psVar9 + 9) * 8);
              goto LAB_0011d7c9;
            }
          }
        }
      }
    }
    else {
      if (*local_90 == '\0') {
        CVar5 = curlx_dyn_addn(&dyn,"",0);
        if (CVar5 != CURLE_OK) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar7 = curlx_dyn_ptr(&dyn);
        *local_78 = pcVar7;
        return CURLE_OK;
      }
LAB_0011d75f:
      pcVar1 = local_90 + 1;
    }
LAB_0011d77e:
    local_90 = pcVar1;
    CVar5 = curlx_dyn_addn(&dyn,__s,sVar6);
    sVar10 = sVar6;
    pcVar7 = __s;
    if (CVar5 != CURLE_OK) {
      return CURLE_OUT_OF_MEMORY;
    }
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, const char *filename,
                        struct URLGlob *glob)
{
  char numbuf[18];
  const char *appendthis = "";
  size_t appendlen = 0;
  struct curlx_dynbuf dyn;

  *result = NULL;

  /* We cannot use the glob_buffer for storage since the filename may be
   * longer than the URL we use.
   */
  curlx_dyn_init(&dyn, MAX_OUTPUT_GLOB_LENGTH);

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      const char *ptr = filename;
      curl_off_t num;
      struct URLPattern *pat = NULL;
      filename++;
      if(!curlx_str_number(&filename, &num, glob->size) && num) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i < glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*" CURL_FORMAT_CURL_OFF_T,
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(tool_stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          curlx_dyn_free(&dyn);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(curlx_dyn_addn(&dyn, appendthis, appendlen))
      return CURLE_OUT_OF_MEMORY;
  }

  if(curlx_dyn_addn(&dyn, "", 0))
    return CURLE_OUT_OF_MEMORY;

#if defined(_WIN32) || defined(MSDOS)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, curlx_dyn_ptr(&dyn),
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    curlx_dyn_free(&dyn);
    if(sc)
      return CURLE_URL_MALFORMAT;
    *result = sanitized;
    return CURLE_OK;
  }
#else
  *result = curlx_dyn_ptr(&dyn);
  return CURLE_OK;
#endif /* _WIN32 || MSDOS */
}